

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_publication.cpp
# Opt level: O3

void __thiscall
miniros::ServiceCallback::ServiceCallback
          (ServiceCallback *this,ServiceCallbackHelperPtr *helper,shared_ptr<unsigned_char[]> *buf,
          size_t num_bytes,ServiceClientLinkPtr *link,bool has_tracked_object,
          VoidConstWPtr *tracked_object)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_CallbackInterface)._vptr_CallbackInterface =
       (_func_int **)&PTR__ServiceCallback_002ab5a0;
  (this->helper_).super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (helper->super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var1 = (helper->super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->helper_).super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->buffer_).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (buf->super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (buf->super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->buffer_).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->num_bytes_ = (uint32_t)num_bytes;
  (this->link_).super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (link->super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (link->super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->link_).super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->has_tracked_object_ = has_tracked_object;
  (this->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (tracked_object->super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (tracked_object->super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
      return;
    }
    LOCK();
    p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

ServiceCallback(const ServiceCallbackHelperPtr& helper, const std::shared_ptr<uint8_t[]>& buf, size_t num_bytes,
          const ServiceClientLinkPtr& link, bool has_tracked_object, const VoidConstWPtr& tracked_object)
  : helper_(helper)
  , buffer_(buf)
  , num_bytes_(num_bytes)
  , link_(link)
  , has_tracked_object_(has_tracked_object)
  , tracked_object_(tracked_object)
  {
  }